

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O2

Expression *
slang::ast::StreamingConcatenationExpression::fromSyntax
          (Compilation *comp,StreamingConcatenationExpressionSyntax *syntax,ASTContext *context)

{
  SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax> *pSVar1;
  TokenKind TVar2;
  ulong uVar3;
  size_t sVar4;
  ElementSelectSyntax *syntax_00;
  undefined1 auVar5 [16];
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  uint uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  SourceLocation SVar10;
  undefined4 extraout_var;
  Expression *pEVar11;
  optional<int> value;
  StreamExpressionSyntax *pSVar12;
  Type *this;
  Type *pTVar13;
  Type *this_00;
  uint64_t uVar14;
  ulong uVar15;
  undefined4 extraout_var_00;
  StreamingConcatenationExpression *type;
  Diagnostic *pDVar16;
  int iVar17;
  ParentList *pPVar18;
  const_iterator *src;
  const_iterator *extraout_RDX;
  undefined8 extraout_RDX_00;
  SourceLocation in_R8;
  char cVar19;
  SourceRange sourceRange_01;
  SourceRange SVar20;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar21;
  optional<slang::ConstantRange> oVar22;
  uint64_t bitstreamWidth;
  uint64_t local_450;
  uint local_444;
  anon_class_24_3_37492b14 badResult;
  uint local_428;
  const_iterator __begin2;
  SmallVector<slang::ast::StreamingConcatenationExpression::StreamExpression,_4UL> buffer;
  EvalContext evalCtx;
  
  uVar3 = (context->flags).m_bits;
  TVar2 = (syntax->operatorToken).kind;
  badResult.sliceSize = &local_450;
  local_450 = 0;
  badResult.comp = comp;
  badResult.syntax = syntax;
  if ((-1 < (char)uVar3) &&
     ((local_428 = (uint)uVar3, (local_428 >> 0x14 & 1) != 0 ||
      (((comp->options).flags.m_bits & 0x800) == 0)))) {
    SVar10 = parsing::Token::location(&syntax->operatorToken);
    ASTContext::addDiag(context,(DiagCode)0x2a0007,SVar10);
LAB_00639770:
    pEVar11 = fromSyntax::anon_class_24_3_37492b14::operator()(&badResult);
    return pEVar11;
  }
  if (syntax->sliceSize == (ExpressionSyntax *)0x0) {
    if (TVar2 == LeftShift) {
      local_450 = 1;
    }
  }
  else {
    iVar8 = Expression::bind((int)syntax->sliceSize,(sockaddr *)context,4);
    pEVar11 = (Expression *)CONCAT44(extraout_var,iVar8);
    bVar7 = Expression::bad(pEVar11);
    if (bVar7) goto LAB_00639770;
    if (pEVar11->kind == DataType) {
      bVar7 = Type::isFixedSize((pEVar11->type).ptr);
      if (!bVar7) {
        pDVar16 = ASTContext::addDiag(context,(DiagCode)0x2d0007,pEVar11->sourceRange);
        SVar10 = (((pEVar11->type).ptr)->super_Symbol).location;
        if (((ulong)SVar10 & 0xfffffff) != 0) {
          Diagnostic::addNote(pDVar16,(DiagCode)0x50001,SVar10);
        }
        goto LAB_00639770;
      }
      local_450 = Type::getBitstreamWidth((pEVar11->type).ptr);
    }
    else {
      pTVar13 = (Type *)context;
      value = ASTContext::evalInteger(context,pEVar11,(bitmask<slang::ast::EvalFlags>)0x0);
      bVar7 = ASTContext::requireGtZero(context,value,pEVar11->sourceRange);
      if (!bVar7) goto LAB_00639770;
      local_450 = (ulong)value.super__Optional_base<int,_true,_true>._M_payload.
                         super__Optional_payload_base<int> & 0xffffffff;
      context = (ASTContext *)pTVar13;
    }
    if (TVar2 != LeftShift) {
      local_450 = 0;
      SVar20 = slang::syntax::SyntaxNode::sourceRange(&syntax->sliceSize->super_SyntaxNode);
      ASTContext::addDiag(context,(DiagCode)0xc20007,SVar20);
    }
  }
  bitstreamWidth = 0;
  buffer.super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>.data_
       = (pointer)buffer.
                  super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
                  .firstElement;
  buffer.super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>.len =
       0;
  buffer.super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>.cap =
       4;
  pSVar1 = &syntax->expressions;
  src = &__begin2;
  __begin2.index = 0;
  __begin2.list = pSVar1;
  sVar4 = (syntax->expressions).elements._M_extent._M_extent_value;
  uVar15 = 0;
  pPVar18 = pSVar1;
  while( true ) {
    if ((pPVar18 == pSVar1) && (uVar15 == sVar4 + 1 >> 1)) {
      pTVar13 = comp->voidType;
      iVar8 = SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::copy
                        (&buffer.
                          super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
                         ,(EVP_PKEY_CTX *)comp,(EVP_PKEY_CTX *)src);
      evalCtx.astCtx.scope.ptr = (Scope *)CONCAT44(extraout_var_00,iVar8);
      evalCtx.astCtx._8_8_ = extraout_RDX_00;
      __begin2 = (const_iterator)slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      type = BumpAllocator::
             emplace<slang::ast::StreamingConcatenationExpression,slang::ast::Type_const&,unsigned_long&,unsigned_long&,std::span<slang::ast::StreamingConcatenationExpression::StreamExpression_const,18446744073709551615ul>,slang::SourceRange>
                       (&comp->super_BumpAllocator,pTVar13,&local_450,&bitstreamWidth,
                        (span<const_slang::ast::StreamingConcatenationExpression::StreamExpression,_18446744073709551615UL>
                         *)&evalCtx,(SourceRange *)&__begin2);
      if ((((bitmask<slang::ast::ASTFlags> *)&(((Type *)context)->super_Symbol).name._M_str)->m_bits
          & 0x80) == 0) {
        uVar14 = 0xffffff;
        if (bitstreamWidth < 0xffffff) {
          uVar14 = bitstreamWidth;
        }
        pTVar13 = Compilation::getType
                            (comp,(bitwidth_t)uVar14,(bitmask<slang::ast::IntegralFlags>)0x2);
        SVar20.endLoc = (SourceLocation)0x0;
        SVar20.startLoc = (type->super_Expression).sourceRange.endLoc;
        type = (StreamingConcatenationExpression *)
               Expression::convertAssignment
                         ((Expression *)context,(ASTContext *)pTVar13,(Type *)type,
                          (Expression *)(type->super_Expression).sourceRange.startLoc,SVar20,
                          (Expression **)0x0,(bitmask<slang::ast::AssignFlags> *)context);
      }
      goto LAB_00639d20;
    }
    pSVar12 = slang::syntax::SeparatedSyntaxList<slang::syntax::StreamExpressionSyntax>::
              iterator_base<const_slang::syntax::StreamExpressionSyntax_*>::dereference(&__begin2);
    pTVar13 = (Type *)(pSVar12->expression).ptr;
    this = (Type *)Expression::selfDetermined
                             (comp,(ExpressionSyntax *)pTVar13,context,
                              (bitmask<slang::ast::ASTFlags>)0x80);
    bVar7 = Expression::bad((Expression *)this);
    if (bVar7) {
      type = (StreamingConcatenationExpression *)
             fromSyntax::anon_class_24_3_37492b14::operator()(&badResult);
      goto LAB_00639d20;
    }
    this_00 = (Type *)(this->super_Symbol).name._M_len;
    if (pSVar12->withRange != (StreamExpressionWithRangeSyntax *)0x0) break;
    cVar19 = '\0';
    pEVar11 = (Expression *)0x0;
LAB_00639a76:
    if ((((pSVar12->expression).ptr)->super_SyntaxNode).kind != StreamingConcatenationExpression) {
      bVar7 = Type::isUnpackedUnion(this_00);
      pTVar13 = (Type *)context;
      if ((bVar7) && (bVar7 = Type::isTaggedUnion(this_00), pTVar13 = (Type *)context, !bVar7)) {
        pTVar13 = Type::getCanonicalType(this_00);
        sVar21 = Scope::members((Scope *)(pTVar13 + 1));
        pTVar13 = (Type *)context;
        if (sVar21._M_begin.current.current != sVar21._M_end.current.current) {
          this_00 = DeclaredType::getType((DeclaredType *)(sVar21._M_begin.current.current + 1));
          pTVar13 = (Type *)context;
        }
      }
      bVar7 = Type::isBitstreamType(this_00,(bool)((byte)(uVar3 >> 0x14) & 1));
      sourceRange_00.startLoc = (SourceLocation)(this->super_Symbol).parentScope;
      sourceRange_00.endLoc = (SourceLocation)(this->super_Symbol).nextInScope;
      if (bVar7) {
        sourceRange_01.endLoc = in_R8;
        sourceRange_01.startLoc = (SourceLocation)(this->super_Symbol).nextInScope;
        context = (ASTContext *)pTVar13;
        bVar7 = Bitstream::checkClassAccess
                          ((Bitstream *)this_00,pTVar13,
                           (ASTContext *)(this->super_Symbol).parentScope,sourceRange_01);
        if (bVar7) goto LAB_00639afc;
      }
      else {
        pDVar16 = ASTContext::addDiag((ASTContext *)pTVar13,(DiagCode)0x2b0007,sourceRange_00);
        pTVar13 = (Type *)(this->super_Symbol).name._M_len;
        ast::operator<<(pDVar16,pTVar13);
      }
      goto LAB_00639d13;
    }
LAB_00639afc:
    uVar6 = local_444;
    if ((this->super_Symbol).kind == QueueType) {
      uVar15 = *(ulong *)&this[1].super_Symbol;
    }
    else if (pEVar11 == (Expression *)0x0) {
      uVar15 = Type::getBitstreamWidth(this_00);
    }
    else if (cVar19 == '\0') {
      uVar15 = 0;
    }
    else {
      pTVar13 = Type::getArrayElementType(this_00);
      uVar14 = Type::getBitstreamWidth(pTVar13);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar14;
      auVar5 = auVar5 * ZEXT416(uVar6);
      uVar15 = auVar5._0_8_;
      if ((auVar5._8_8_ != 0) || (0x3fffffff8 < uVar15)) {
        pTVar13 = (Type *)0x180009;
        ASTContext::addDiag(context,(DiagCode)0x180009,pEVar11->sourceRange);
        type = (StreamingConcatenationExpression *)
               fromSyntax::anon_class_24_3_37492b14::operator()(&badResult);
        goto LAB_00639d20;
      }
    }
    bitstreamWidth = uVar15 + bitstreamWidth;
    if (0x3fffffff8 < bitstreamWidth) {
      SVar20 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pTVar13 = (Type *)0x180009;
      ASTContext::addDiag(context,(DiagCode)0x180009,SVar20);
      type = (StreamingConcatenationExpression *)
             fromSyntax::anon_class_24_3_37492b14::operator()(&badResult);
LAB_00639d20:
      SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::cleanup
                (&buffer.
                  super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
                 ,(EVP_PKEY_CTX *)pTVar13);
      return &type->super_Expression;
    }
    evalCtx.astCtx.flags.m_bits = (underlying_type)CONCAT14(cVar19,uVar6);
    evalCtx.astCtx.scope.ptr = (Scope *)this;
    evalCtx.astCtx._8_8_ = pEVar11;
    SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>::
    emplace_back<slang::ast::StreamingConcatenationExpression::StreamExpression>
              (&buffer.
                super_SmallVectorBase<slang::ast::StreamingConcatenationExpression::StreamExpression>
               ,(StreamExpression *)&evalCtx);
    uVar15 = __begin2.index + 1;
    __begin2.index = uVar15;
    pPVar18 = __begin2.list;
    src = extraout_RDX;
  }
  bVar7 = Type::isUnpackedArray(this_00);
  if ((bVar7) && (bVar7 = Type::isAssociativeArray(this_00), !bVar7)) {
    pTVar13 = Type::getArrayElementType(this_00);
    bVar7 = Type::isFixedSize(pTVar13);
    if (bVar7) {
      syntax_00 = (pSVar12->withRange->range).ptr;
      ASTContext::resetFlags(&evalCtx.astCtx,context,(bitmask<slang::ast::ASTFlags>)0x200000000);
      pTVar13 = this;
      pEVar11 = Expression::bindSelector(comp,(Expression *)this,syntax_00,&evalCtx.astCtx);
      bVar7 = Expression::bad(pEVar11);
      if (!bVar7) {
        evalCtx.astCtx.assertionInstance =
             *(AssertionInstanceDetails **)&(((Type *)context)->super_Symbol).indexInScope;
        evalCtx.astCtx.scope.ptr = *(Scope **)&((Type *)context)->super_Symbol;
        evalCtx.astCtx._8_8_ = (((Type *)context)->super_Symbol).name._M_len;
        evalCtx.astCtx.flags.m_bits =
             ((bitmask<slang::ast::ASTFlags> *)&(((Type *)context)->super_Symbol).name._M_str)->
             m_bits;
        evalCtx.astCtx.instanceOrProc = *(Symbol **)&(((Type *)context)->super_Symbol).location;
        evalCtx.astCtx.firstTempVar = (TempVarSymbol *)(((Type *)context)->super_Symbol).parentScope
        ;
        evalCtx.astCtx.randomizeDetails =
             (RandomizeDetails *)(((Type *)context)->super_Symbol).nextInScope;
        evalCtx.flags.m_bits = '\0';
        evalCtx._60_8_ = 0;
        evalCtx._68_8_ = 0;
        evalCtx.queueTarget._4_4_ = 0;
        evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.data_ =
             (pointer)evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.
                      firstElement;
        evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.len = 0;
        evalCtx.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>.cap = 2;
        evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ =
             (pointer)evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.firstElement;
        evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.len = 0;
        evalCtx.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.cap = 5;
        evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.data_ =
             (pointer)evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.firstElement;
        evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.len = 0;
        evalCtx.diags.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.cap = 2;
        evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.data_ =
             (pointer)evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
                      super_SmallVectorBase<slang::Diagnostic>.firstElement;
        evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.len = 0;
        evalCtx.warnings.super_SmallVector<slang::Diagnostic,_2UL>.
        super_SmallVectorBase<slang::Diagnostic>.cap = 2;
        evalCtx.backtraceReported = false;
        evalCtx.disableRange.startLoc = (SourceLocation)0x0;
        evalCtx.disableRange.endLoc = (SourceLocation)0x0;
        oVar22 = Expression::evalSelector(pEVar11,&evalCtx,false);
        if (((undefined1  [12])
             oVar22.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ConstantRange> & (undefined1  [12])0x1) ==
            (undefined1  [12])0x0) {
          cVar19 = '\0';
        }
        else {
          iVar9 = oVar22.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_payload._0_4_;
          iVar17 = oVar22.super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                   super__Optional_payload_base<slang::ConstantRange>._M_payload._4_4_;
          iVar8 = iVar9 - iVar17;
          if (iVar9 - iVar17 == 0 || iVar9 < iVar17) {
            iVar8 = -(iVar9 - iVar17);
          }
          local_444 = iVar8 + 1;
          cVar19 = '\x01';
        }
        EvalContext::~EvalContext(&evalCtx);
        goto LAB_00639a76;
      }
      goto LAB_00639d13;
    }
  }
  sourceRange.startLoc = (SourceLocation)(this->super_Symbol).parentScope;
  sourceRange.endLoc = (SourceLocation)(this->super_Symbol).nextInScope;
  pTVar13 = (Type *)0x310007;
  ASTContext::addDiag(context,(DiagCode)0x310007,sourceRange);
LAB_00639d13:
  type = (StreamingConcatenationExpression *)
         fromSyntax::anon_class_24_3_37492b14::operator()(&badResult);
  goto LAB_00639d20;
}

Assistant:

Expression& StreamingConcatenationExpression::fromSyntax(
    Compilation& comp, const StreamingConcatenationExpressionSyntax& syntax,
    const ASTContext& context) {

    const bool isDestination = context.flags.has(ASTFlags::LValue);
    const bool isRightToLeft = syntax.operatorToken.kind == TokenKind::LeftShift;
    uint64_t sliceSize = 0;

    auto badResult = [&]() -> Expression& {
        return badExpr(comp, comp.emplace<StreamingConcatenationExpression>(
                                 comp.getErrorType(), sliceSize, 0u,
                                 std::span<const StreamExpression>(), syntax.sourceRange()));
    };

    if (!context.flags.has(ASTFlags::StreamingAllowed) &&
        (isDestination || !comp.hasFlag(CompilationFlags::AllowSelfDeterminedStreamConcat))) {
        context.addDiag(diag::BadStreamContext, syntax.operatorToken.location());
        return badResult();
    }

    if (syntax.sliceSize) {
        // The slice_size determines the size of each block. If specified, it may be a constant
        // integral expression or a simple type.
        auto& sliceExpr = bind(*syntax.sliceSize, context, ASTFlags::AllowDataType);
        if (sliceExpr.bad())
            return badResult();

        if (sliceExpr.kind == ExpressionKind::DataType) {
            if (!sliceExpr.type->isFixedSize()) {
                auto& diag = context.addDiag(diag::BadStreamSlice, sliceExpr.sourceRange);
                if (sliceExpr.type->location)
                    diag.addNote(diag::NoteDeclarationHere, sliceExpr.type->location);
                return badResult();
            }
            sliceSize = sliceExpr.type->getBitstreamWidth();
        }
        else {
            // It shall be an error for the value to be zero or negative.
            std::optional<int32_t> count = context.evalInteger(sliceExpr);
            if (!context.requireGtZero(count, sliceExpr.sourceRange))
                return badResult();
            sliceSize = static_cast<uint32_t>(*count);
        }

        if (!isRightToLeft) {
            // Left-to-right streaming using >> shall cause the slice_size to be ignored and no
            // re-ordering performed.
            sliceSize = 0;
            context.addDiag(diag::IgnoredSlice, syntax.sliceSize->sourceRange());
        }
    }
    else if (isRightToLeft) {
        // If a slice_size is not specified, the default is 1.
        sliceSize = 1;
    }

    uint64_t bitstreamWidth = 0;
    SmallVector<StreamExpression, 4> buffer;
    for (const auto argSyntax : syntax.expressions) {
        auto& arg = selfDetermined(comp, *argSyntax->expression, context,
                                   ASTFlags::StreamingAllowed);
        if (arg.bad())
            return badResult();

        const Type* argType = arg.type;
        const Expression* withExpr = nullptr;
        std::optional<bitwidth_t> constantWithWidth;
        if (argSyntax->withRange) {
            // The expression before the with can be any one-dimensional unpacked array
            // (including a queue).
            if (!argType->isUnpackedArray() || argType->isAssociativeArray() ||
                !argType->getArrayElementType()->isFixedSize()) {
                context.addDiag(diag::BadStreamWithType, arg.sourceRange);
                return badResult();
            }

            withExpr = &bindSelector(comp, arg, *argSyntax->withRange->range,
                                     context.resetFlags(ASTFlags::StreamingWithRange));
            if (withExpr->bad())
                return badResult();

            // Try to get the bounds of the selection, if they are constant.
            // If they are constant, we've already done bounds checking and
            // max size checking on them.
            EvalContext evalCtx(context);
            auto range = withExpr->evalSelector(evalCtx, /* enforceBounds */ false);
            if (range)
                constantWithWidth = range->width();
        }

        if (argSyntax->expression->kind != SyntaxKind::StreamingConcatenationExpression) {
            // Unpacked unions get "unwrapped" to their first member when streaming.
            if (argType->isUnpackedUnion() && !argType->isTaggedUnion()) {
                auto& uu = argType->getCanonicalType().as<UnpackedUnionType>();
                auto members = uu.members();
                if (members.begin() != members.end())
                    argType = &members.begin()->as<ValueSymbol>().getType();
            }

            if (!argType->isBitstreamType(isDestination)) {
                context.addDiag(diag::BadStreamExprType, arg.sourceRange) << *arg.type;
                return badResult();
            }

            if (!Bitstream::checkClassAccess(*argType, context, arg.sourceRange))
                return badResult();
        }

        uint64_t argWidth = 0;
        if (arg.kind == ExpressionKind::Streaming) {
            argWidth = arg.as<StreamingConcatenationExpression>().getBitstreamWidth();
        }
        else if (withExpr) {
            if (constantWithWidth) {
                auto rangeBits = checkedMulU64(argType->getArrayElementType()->getBitstreamWidth(),
                                               *constantWithWidth);
                if (!rangeBits || rangeBits > Type::MaxBitWidth) {
                    context.addDiag(diag::ObjectTooLarge, withExpr->sourceRange);
                    return badResult();
                }

                argWidth = *rangeBits;
            }
        }
        else {
            argWidth = argType->getBitstreamWidth();
        }

        bitstreamWidth += argWidth;
        if (bitstreamWidth > Type::MaxBitWidth) {
            context.addDiag(diag::ObjectTooLarge, syntax.sourceRange());
            return badResult();
        }

        buffer.push_back({&arg, withExpr, constantWithWidth});
    }

    // So normally the type of a streaming concatenation is never inspected,
    // since it can only be used in assignments and there is explicit handling
    // of these expressions there. We use a void type for the result to represent
    // this (also because otherwise what type can we use for e.g. non fixed-size
    // streams). However, in VCS compat mode the error about requiring an assignment
    // context can be silenced, so we need to come up with a real result type here,
    // which we do by converting to a packed bit vector of bitstream width.
    auto& result = *comp.emplace<StreamingConcatenationExpression>(
        comp.getVoidType(), sliceSize, bitstreamWidth, buffer.ccopy(comp), syntax.sourceRange());

    if (!context.flags.has(ASTFlags::StreamingAllowed)) {
        // Cap the width so we don't overflow. The conversion will error for us
        // since the target width will be less than the source width.
        auto width = std::min(bitstreamWidth, (uint64_t)SVInt::MAX_BITS);
        auto& type = comp.getType(bitwidth_t(width), IntegralFlags::FourState);
        return convertAssignment(context, type, result, result.sourceRange);
    }

    return result;
}